

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall cmConfigureLog::WriteValue(cmConfigureLog *this,string_view key,int value)

{
  ofstream *__os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *this_00;
  int value_local;
  cmConfigureLog *this_local;
  string_view key_local;
  
  __os = BeginLine(this);
  pbVar1 = std::operator<<(&__os->super_basic_ostream<char,_std::char_traits<char>_>,key);
  this_00 = std::operator<<(pbVar1,": ");
  std::ostream::operator<<(this_00,value);
  EndLine(this);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key, int value)
{
  this->BeginLine() << key << ": " << value;
  this->EndLine();
}